

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_session_ecdh_curve_type(char *name,libssh2_curve_type *out_type)

{
  int iVar1;
  libssh2_curve_type local_28;
  int local_24;
  libssh2_curve_type type;
  int ret;
  libssh2_curve_type *out_type_local;
  char *name_local;
  
  local_24 = 0;
  if (name == (char *)0x0) {
    name_local._4_4_ = -1;
  }
  else {
    iVar1 = strcmp(name,"ecdh-sha2-nistp256");
    if (iVar1 == 0) {
      local_28 = LIBSSH2_EC_CURVE_NISTP256;
    }
    else {
      iVar1 = strcmp(name,"ecdh-sha2-nistp384");
      if (iVar1 == 0) {
        local_28 = LIBSSH2_EC_CURVE_NISTP384;
      }
      else {
        iVar1 = strcmp(name,"ecdh-sha2-nistp521");
        if (iVar1 == 0) {
          local_28 = LIBSSH2_EC_CURVE_NISTP521;
        }
        else {
          local_24 = -1;
        }
      }
    }
    if ((local_24 == 0) && (out_type != (libssh2_curve_type *)0x0)) {
      *out_type = local_28;
    }
    name_local._4_4_ = local_24;
  }
  return name_local._4_4_;
}

Assistant:

static int
kex_session_ecdh_curve_type(const char *name, libssh2_curve_type *out_type)
{
    int ret = 0;
    libssh2_curve_type type;

    if(!name)
        return -1;

    if(strcmp(name, "ecdh-sha2-nistp256") == 0)
        type = LIBSSH2_EC_CURVE_NISTP256;
    else if(strcmp(name, "ecdh-sha2-nistp384") == 0)
        type = LIBSSH2_EC_CURVE_NISTP384;
    else if(strcmp(name, "ecdh-sha2-nistp521") == 0)
        type = LIBSSH2_EC_CURVE_NISTP521;
    else {
/* silence:
   warning C4701: potentially uninitialized local variable 'type' used */
#if defined(_MSC_VER)
        type = (libssh2_curve_type)0;
#endif
        ret = -1;
    }

    if(ret == 0 && out_type) {
        *out_type = type;
    }

    return ret;
}